

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O2

void WebRtcIsac_InitPreFilterbank(PreFiltBankstr *prefiltdata)

{
  long lVar1;
  
  for (lVar1 = -0x60; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined8 *)((long)prefiltdata->INLABUF2 + lVar1 * 2) = 0;
    *(undefined8 *)((long)prefiltdata->INSTAT1_float + lVar1 * 2) = 0;
    *(undefined4 *)((long)prefiltdata->INLABUF2_float + lVar1) = 0;
    *(undefined4 *)((long)prefiltdata->HPstates + lVar1) = 0;
  }
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    prefiltdata->INSTAT1[lVar1] = 0.0;
    prefiltdata->INSTAT2[lVar1] = 0.0;
    prefiltdata->INSTATLA1[lVar1] = 0.0;
    prefiltdata->INSTATLA2[lVar1] = 0.0;
    prefiltdata->INSTAT1_float[lVar1] = 0.0;
    prefiltdata->INSTAT2_float[lVar1] = 0.0;
    prefiltdata->INSTATLA1_float[lVar1] = 0.0;
    prefiltdata->INSTATLA2_float[lVar1] = 0.0;
  }
  prefiltdata->HPstates[0] = 0.0;
  prefiltdata->HPstates[1] = 0.0;
  prefiltdata->HPstates_float[0] = 0.0;
  prefiltdata->HPstates_float[1] = 0.0;
  return;
}

Assistant:

void WebRtcIsac_InitPreFilterbank(PreFiltBankstr *prefiltdata)
{
  int k;

  for (k = 0; k < QLOOKAHEAD; k++) {
    prefiltdata->INLABUF1[k] = 0;
    prefiltdata->INLABUF2[k] = 0;

    prefiltdata->INLABUF1_float[k] = 0;
    prefiltdata->INLABUF2_float[k] = 0;
  }
  for (k = 0; k < 2*(QORDER-1); k++) {
    prefiltdata->INSTAT1[k] = 0;
    prefiltdata->INSTAT2[k] = 0;
    prefiltdata->INSTATLA1[k] = 0;
    prefiltdata->INSTATLA2[k] = 0;

    prefiltdata->INSTAT1_float[k] = 0;
    prefiltdata->INSTAT2_float[k] = 0;
    prefiltdata->INSTATLA1_float[k] = 0;
    prefiltdata->INSTATLA2_float[k] = 0;
  }

  /* High pass filter states */
  prefiltdata->HPstates[0] = 0.0;
  prefiltdata->HPstates[1] = 0.0;

  prefiltdata->HPstates_float[0] = 0.0f;
  prefiltdata->HPstates_float[1] = 0.0f;

  return;
}